

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O3

Clause * __thiscall
Inferences::resolveClausesHelper
          (Inferences *this,InductionContext *context,Stack<Kernel::Clause_*> *cls,
          ElementIterator eIt,Substitution *subst,bool generalized,bool applySubst,
          Substitution *indLitSubst)

{
  int iVar1;
  Unit *pUVar2;
  undefined8 *puVar3;
  bool bVar4;
  Self SVar5;
  UnitList *pUVar6;
  long lVar7;
  UnitList *pUVar8;
  Unit *pUVar9;
  Literal *pLVar10;
  Literal *lit_00;
  Literal *pLVar11;
  Literal **ppLVar12;
  Clause *pCVar13;
  char cVar14;
  int res_1;
  uint uVar15;
  long *plVar16;
  int res;
  Literal **lit;
  undefined8 *puVar17;
  undefined8 *puVar18;
  undefined7 in_stack_00000011;
  RStack<Literal_*> resLits;
  TermReplacement tr;
  Inference inf;
  RobSubstitution renaming;
  ulong local_200;
  uint local_1e8;
  char local_1dc;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_1d8;
  undefined1 local_1c8 [56];
  _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
  local_190;
  Inference local_160;
  RobSubstitution local_130;
  Inference local_68;
  
  Kernel::RobSubstitution::RobSubstitution(&local_130);
  iVar1 = *(int *)(eIt._0_8_ + (long)(int)cls * 4);
  pUVar2 = (Unit *)(context->_indTerms).
                   super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[(int)cls];
  pUVar6 = (UnitList *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pUVar6->_head = pUVar2;
  pUVar6->_tail = (List<Kernel::Unit_*> *)0x0;
  while (iVar1 != -1) {
    lVar7 = (long)iVar1;
    iVar1 = *(int *)(eIt._0_8_ + lVar7 * 4);
    pUVar9 = (Unit *)(context->_indTerms).
                     super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[lVar7];
    pUVar8 = (UnitList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar8->_head = pUVar9;
    pUVar8->_tail = pUVar6;
    pUVar6 = pUVar8;
  }
  for (puVar17 = *(undefined8 **)(this + 0x28); puVar17 != (undefined8 *)0x0;
      puVar17 = (undefined8 *)*puVar17) {
    pUVar9 = (Unit *)puVar17[1];
    pUVar8 = (UnitList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar8->_head = pUVar9;
    pUVar8->_tail = pUVar6;
    pUVar6 = pUVar8;
  }
  local_1dc = (char)subst;
  cVar14 = 'G';
  if (local_1dc == '\0') {
    cVar14 = (CONCAT71(in_stack_00000011,applySubst) != 0) * '\x02' + 'F';
  }
  local_1c8._1_7_ = (undefined7)((ulong)local_1c8._0_8_ >> 8);
  local_1c8[0] = cVar14;
  local_1c8._8_8_ = pUVar6;
  Kernel::Inference::Inference(&local_160,(GeneratingInferenceMany *)local_1c8);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_1d8);
  local_1e8 = pUVar2[1]._number & 0xfffff;
  if ((pUVar2[1]._number & 0xfffff) != 0) {
    pUVar9 = pUVar2 + 1 + 1;
    uVar15 = 1;
    do {
      pLVar11 = *(Literal **)pUVar9;
      pLVar10 = Kernel::Literal::complementaryLiteral(pLVar11);
      pLVar10 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar10,(Substitution *)eIt._data);
      for (puVar17 = *(undefined8 **)(this + 0x28); puVar17 != (undefined8 *)0x0;
          puVar17 = (undefined8 *)*puVar17) {
        puVar3 = (undefined8 *)puVar17[4];
        for (puVar18 = (undefined8 *)puVar17[3]; puVar18 != puVar3; puVar18 = puVar18 + 1) {
          lit_00 = (Literal *)*puVar18;
          if ((Substitution *)CONCAT71(in_stack_00000011,applySubst) != (Substitution *)0x0) {
            lit_00 = Kernel::SubstHelper::apply<Kernel::Substitution>
                               (lit_00,(Substitution *)CONCAT71(in_stack_00000011,applySubst));
          }
          if (lit_00 == pLVar10) goto LAB_004df4b5;
        }
      }
      if (generalized) {
        getContextReplacementMap
                  ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                    *)&local_190,(InductionContext *)this,true);
        local_1c8._0_8_ = &PTR_transform_00b392c0;
        std::
        _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
        ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                    *)(local_1c8 + 8),&local_190);
        std::
        _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
        ::~_Rb_tree(&local_190);
        pLVar11 = Kernel::SubstHelper::apply<Kernel::Substitution>
                            (pLVar11,(Substitution *)eIt._data);
        pLVar11 = Kernel::TermTransformerCommon::transformLiteral
                            ((TermTransformerCommon *)local_1c8,pLVar11);
        local_1c8._0_8_ = &PTR_transform_00b392c0;
        std::
        _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
        ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                     *)(local_1c8 + 8));
      }
      SVar5._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           local_1d8._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
      pLVar11 = Kernel::RobSubstitution::apply(&local_130,pLVar11,0);
      ppLVar12 = *(Literal ***)
                  ((long)SVar5._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                  + 0x10);
      if (ppLVar12 ==
          *(Literal ***)
           ((long)SVar5._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18
           )) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   SVar5._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        ppLVar12 = *(Literal ***)
                    ((long)SVar5._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl + 0x10);
      }
      *ppLVar12 = pLVar11;
      *(Literal ***)
       ((long)SVar5._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           *(Literal ***)
            ((long)SVar5._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) + 1;
LAB_004df4b5:
      pUVar9 = (Unit *)(&(pUVar2 + 1)[1]._number + (long)(int)uVar15 * 2);
      bVar4 = uVar15 < local_1e8;
      uVar15 = (uVar15 < local_1e8) + uVar15;
    } while (bVar4);
  }
  plVar16 = *(long **)(this + 0x28);
  if (plVar16 != (long *)0x0) {
    do {
      if ((*(uint *)(plVar16[1] + 0x38) & 0xfffff) != 0) {
        local_200 = 0;
        do {
          puVar18 = (undefined8 *)plVar16[4];
          for (puVar17 = (undefined8 *)plVar16[3]; puVar17 != puVar18; puVar17 = puVar17 + 1) {
            getContextReplacementMap
                      ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)&local_190,(InductionContext *)this,true);
            local_1c8._0_8_ = &PTR_transform_00b392c0;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)(local_1c8 + 8),&local_190);
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree(&local_190);
            pLVar10 = Kernel::TermTransformerCommon::transformLiteral
                                ((TermTransformerCommon *)local_1c8,(Literal *)*puVar17);
            pLVar11 = *(Literal **)(plVar16[1] + 0x70 + local_200 * 8);
            local_1c8._0_8_ = &PTR_transform_00b392c0;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                         *)(local_1c8 + 8));
            if (pLVar10 == pLVar11) goto LAB_004df65a;
          }
          pLVar11 = *(Literal **)(plVar16[1] + 0x70 + local_200 * 8);
          if ((Substitution *)CONCAT71(in_stack_00000011,applySubst) != (Substitution *)0x0) {
            pLVar11 = Kernel::SubstHelper::apply<Kernel::Substitution>
                                (pLVar11,(Substitution *)CONCAT71(in_stack_00000011,applySubst));
            getContextReplacementMap
                      ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)&local_190,(InductionContext *)this,true);
            local_1c8._0_8_ = &PTR_transform_00b392c0;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)(local_1c8 + 8),&local_190);
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree(&local_190);
            pLVar11 = Kernel::TermTransformerCommon::transformLiteral
                                ((TermTransformerCommon *)local_1c8,pLVar11);
            local_1c8._0_8_ = &PTR_transform_00b392c0;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                         *)(local_1c8 + 8));
          }
          SVar5._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )local_1d8._self;
          pLVar11 = Kernel::RobSubstitution::apply(&local_130,pLVar11,1);
          ppLVar12 = *(Literal ***)
                      ((long)SVar5._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl + 0x10);
          if (ppLVar12 ==
              *(Literal ***)
               ((long)SVar5._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x18)) {
            Lib::Stack<Kernel::Literal_*>::expand
                      ((Stack<Kernel::Literal_*> *)
                       SVar5._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
            ppLVar12 = *(Literal ***)
                        ((long)SVar5._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                               _M_head_impl + 0x10);
          }
          *ppLVar12 = pLVar11;
          *(Literal ***)
           ((long)SVar5._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) = *(Literal ***)
                ((long)SVar5._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
LAB_004df65a:
          local_200 = local_200 + 1;
        } while (local_200 < ((uint)*(undefined8 *)(plVar16[1] + 0x38) & 0xfffff));
      }
      plVar16 = (long *)*plVar16;
    } while (plVar16 != (long *)0x0);
  }
  local_68._0_8_ = local_160._0_8_;
  local_68._8_4_ = local_160._8_4_;
  local_68._age = local_160._age;
  local_68._splits = local_160._splits;
  local_68._ptr1 = local_160._ptr1;
  local_68._ptr2 = local_160._ptr2;
  local_68.th_ancestors = local_160.th_ancestors;
  local_68.all_ancestors = local_160.all_ancestors;
  pCVar13 = Kernel::Clause::fromStack
                      ((Stack<Kernel::Literal_*> *)
                       local_1d8._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                       &local_68);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_1d8);
  Kernel::RobSubstitution::~RobSubstitution(&local_130);
  return pCVar13;
}

Assistant:

Clause* resolveClausesHelper(const InductionContext& context, const Stack<Clause*>& cls, IntUnionFind::ElementIterator eIt, Substitution& subst, bool generalized, bool applySubst, Substitution* indLitSubst)
{
  // first create the clause with the required size
  RobSubstitution renaming;
  ASS(eIt.hasNext());
  auto cl = cls[eIt.next()];
  auto premises = UnitList::singleton(cl);
  const auto& toResolve = context._cls;
  while (eIt.hasNext()) {
    auto other = cls[eIt.next()];
    UnitList::push(other,premises);
  }

  for (const auto& kv : toResolve) {
    UnitList::push(kv.first, premises);
  }

  Inference inf(GeneratingInferenceMany(
    generalized ? InferenceRule::GEN_INDUCTION_HYPERRESOLUTION
                : ( indLitSubst ? InferenceRule::FREE_VAR_INDUCTION_HYPERRESOLUTION : InferenceRule::INDUCTION_HYPERRESOLUTION),
    premises));
  RStack<Literal*> resLits;

  for (Literal* curr : cl->iterLits()) {
    auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral(curr), subst);
    bool contains = false;
    for (const auto& kv : toResolve) {
      for (const auto& lit : kv.second) {
        Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
        if (slit == clit) {
          contains = true;
          break;
        }
      }
      if (contains) {
        break;
      }
    }
    if (!contains) {
      Literal* resLit;
      if (applySubst) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        resLit = tr.transformLiteral(SubstHelper::apply<Substitution>(curr,subst));
      } else {
        resLit = curr;
      }
      resLits->push(renaming.apply(resLit,0));
    }
  }

  for (const auto& kv : toResolve) {
    for (unsigned i = 0; i < kv.first->length(); i++) {
      bool copyCurr = true;
      for (const auto& lit : kv.second) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        auto rlit = tr.transformLiteral(lit);
        if (rlit == (*kv.first)[i]) {
          copyCurr = false;
          break;
        }
      }
      if (copyCurr) {
        Literal* l = (*kv.first)[i];
        if (indLitSubst) {
          l = SubstHelper::apply<Substitution>((*kv.first)[i], *indLitSubst);
          TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
          l = tr.transformLiteral(l);
        }
        resLits->push(renaming.apply(l,1));
      }
    }
  }

  return Clause::fromStack(*resLits, inf);
}